

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void skip_spaces(FT_Byte **acur,FT_Byte *limit)

{
  FT_Byte *cur;
  byte *pbVar1;
  ulong uVar3;
  byte *pbVar2;
  
  pbVar1 = *acur;
  do {
    if ((limit <= pbVar1) || (uVar3 = (ulong)*pbVar1, 0x25 < uVar3)) goto LAB_00150031;
    pbVar2 = pbVar1;
    if ((0x100003601U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 != 0x25) {
LAB_00150031:
        *acur = pbVar1;
        return;
      }
      do {
        pbVar2 = pbVar1;
        if ((*pbVar1 == 10) || (*pbVar1 == 0xd)) break;
        pbVar1 = pbVar1 + 1;
        pbVar2 = limit;
      } while (pbVar1 != limit);
    }
    pbVar1 = pbVar2 + 1;
  } while( true );
}

Assistant:

static void
  skip_spaces( FT_Byte*  *acur,
               FT_Byte*   limit )
  {
    FT_Byte*  cur = *acur;


    while ( cur < limit )
    {
      if ( !IS_PS_SPACE( *cur ) )
      {
        if ( *cur == '%' )
          /* According to the PLRM, a comment is equal to a space. */
          skip_comment( &cur, limit );
        else
          break;
      }
      cur++;
    }

    *acur = cur;
  }